

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AutoLink(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,NodeRange nr)

{
  NodeRange nr_00;
  NodeRange NVar1;
  bool bVar2;
  NodeIndexRange in_RDX;
  ValueNode *in_RSI;
  vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *in_RDI;
  vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *in_stack_ffffffffffffffc0;
  NodeIndexRange in_stack_ffffffffffffffc8;
  NodeIndexRange in_stack_ffffffffffffffe8;
  
  bVar2 = DoingAutoLinking((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)0x47b1d1);
  if (bVar2) {
    bVar2 = std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::empty(in_RDI);
    if (!bVar2) {
      in_stack_ffffffffffffffc8 = in_RDX;
      std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::back
                (in_stack_ffffffffffffffc0);
      nr_00.ir_ = in_stack_ffffffffffffffe8;
      nr_00.pvn_ = (ValueNode *)in_stack_ffffffffffffffc8;
      in_RDX = in_stack_ffffffffffffffc8;
      bVar2 = pre::NodeRange::TryExtendBy((NodeRange *)in_RSI,nr_00);
      if (bVar2) goto LAB_0047b23c;
    }
    std::vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffffc8);
  }
LAB_0047b23c:
  NVar1.ir_ = in_RDX;
  NVar1.pvn_ = in_RSI;
  return NVar1;
}

Assistant:

pre::NodeRange AutoLink(pre::NodeRange nr) {
    if (DoingAutoLinking()) {
      if (auto_link_targ_items_.empty() ||
          !auto_link_targ_items_.back().TryExtendBy(nr))
        auto_link_targ_items_.push_back(nr);
    }
    return nr;
  }